

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O1

FxExpression * ParseExpressionJ(FScanner *sc,PClassActor *cls)

{
  bool bVar1;
  FxExpression *this;
  FxExpression *r;
  FxExpression *l;
  
  this = ParseExpressionI(sc,cls);
  bVar1 = FScanner::CheckToken(sc,0x7c);
  l = this;
  if (bVar1) {
    do {
      r = ParseExpressionI(sc,cls);
      this = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
      FxBitOp::FxBitOp((FxBitOp *)this,0x7c,l,r);
      bVar1 = FScanner::CheckToken(sc,0x7c);
      l = this;
    } while (bVar1);
  }
  return this;
}

Assistant:

static FxExpression *ParseExpressionJ (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionI (sc, cls);

	while (sc.CheckToken('|'))
	{
		FxExpression *right = ParseExpressionI (sc, cls);
		tmp = new FxBitOp('|', tmp, right);
	}
	return tmp;
}